

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoTransfer.c
# Opt level: O0

DdNode * reoTransferUnitsToNodes_rec(reo_man *p,reo_unit *pUnit)

{
  int iVar1;
  DdManager *unique;
  uint uVar2;
  reo_unit *prVar3;
  DdNode *E_00;
  DdNode *T_00;
  int local_44;
  int fComp;
  int HKey;
  DdNode *T;
  DdNode *E;
  DdNode *bRes;
  DdManager *dd;
  reo_unit *pUnit_local;
  reo_man *p_local;
  
  unique = p->dd;
  local_44 = -1;
  uVar2 = (uint)pUnit & 1;
  prVar3 = (reo_unit *)((ulong)pUnit & 0xfffffffffffffffe);
  if (prVar3->n != 1) {
    local_44 = (int)((ulong)((long)p->Signature + (long)prVar3 * 0xc00005) %
                    (ulong)(long)p->nTableSize);
    while (p->HTable[local_44].Sign == p->Signature) {
      if (p->HTable[local_44].Arg1 == prVar3) {
        prVar3 = p->HTable[local_44].Arg2;
        if (prVar3 != (reo_unit *)0x0) {
          return (DdNode *)((ulong)prVar3 ^ (long)(int)uVar2);
        }
        __assert_fail("bRes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoTransfer.c"
                      ,0x89,"DdNode *reoTransferUnitsToNodes_rec(reo_man *, reo_unit *)");
      }
      local_44 = (local_44 + 1) % p->nTableSize;
    }
  }
  if (prVar3->lev == 30000) {
    E = cuddUniqueConst(unique,(double)(int)prVar3->pE);
    *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
  }
  else {
    E_00 = reoTransferUnitsToNodes_rec(p,prVar3->pE);
    if (E_00 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + 1;
    T_00 = reoTransferUnitsToNodes_rec(p,prVar3->pT);
    if (T_00 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(unique,E_00);
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + 1;
    if (E_00 == T_00) {
      __assert_fail("E != T",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoTransfer.c"
                    ,0xa5,"DdNode *reoTransferUnitsToNodes_rec(reo_man *, reo_unit *)");
    }
    if (((ulong)T_00 & 1) != 0) {
      __assert_fail("!Cudd_IsComplement(T)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoTransfer.c"
                    ,0xa6,"DdNode *reoTransferUnitsToNodes_rec(reo_man *, reo_unit *)");
    }
    E = cuddUniqueInter(unique,p->pMapToDdVarsFinal[prVar3->lev],T_00,E_00);
    if (E == (DdNode *)0x0) {
      Cudd_RecursiveDeref(unique,E_00);
      Cudd_RecursiveDeref(unique,T_00);
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
    *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + -1;
    *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + -1;
  }
  if (prVar3->n != 1) {
    while (p->HTable[local_44].Sign == p->Signature) {
      local_44 = (local_44 + 1) % p->nTableSize;
    }
    p->HTable[local_44].Sign = p->Signature;
    p->HTable[local_44].Arg1 = prVar3;
    p->HTable[local_44].Arg2 = (reo_unit *)E;
    iVar1 = p->nRefNodes;
    p->nRefNodes = iVar1 + 1;
    p->pRefNodes[iVar1] = E;
    Cudd_Ref(E);
  }
  p->nNodesCur = p->nNodesCur + 1;
  *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) = *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1
  ;
  return (DdNode *)((ulong)E ^ (long)(int)uVar2);
}

Assistant:

DdNode * reoTransferUnitsToNodes_rec( reo_man * p, reo_unit * pUnit )
{
	DdManager * dd = p->dd;
	DdNode * bRes, * E, * T;
	int HKey = -1; // Suppress "might be used uninitialized"
        int fComp;

	fComp = Cudd_IsComplement(pUnit);
	pUnit = Unit_Regular(pUnit);

	// check the hash-table
	if ( pUnit->n != 1 )
	{
		for ( HKey = hashKey2(p->Signature,pUnit,p->nTableSize); p->HTable[HKey].Sign == p->Signature; HKey = (HKey+1) % p->nTableSize )
			if ( p->HTable[HKey].Arg1 == pUnit )
			{
				bRes = (DdNode*) p->HTable[HKey].Arg2;  
				assert( bRes );
				return Cudd_NotCond( bRes, fComp );
			}
	}

	// treat the case of constants
	if ( Unit_IsConstant(pUnit) )
	{
		bRes = cuddUniqueConst( dd, ((double)((int)(ABC_PTRUINT_T)(pUnit->pE))) );
		cuddRef( bRes );
	}
	else
	{
		// split and recur on children of this node
		E = reoTransferUnitsToNodes_rec( p, pUnit->pE );
		if ( E == NULL )
			return NULL;
		cuddRef(E);

		T = reoTransferUnitsToNodes_rec( p, pUnit->pT );
		if ( T == NULL )
		{
			Cudd_RecursiveDeref(dd, E);
			return NULL;
		}
		cuddRef(T);
		
		// consider the case when Res0 and Res1 are the same node
		assert( E != T );
		assert( !Cudd_IsComplement(T) );

		bRes = cuddUniqueInter( dd, p->pMapToDdVarsFinal[pUnit->lev], T, E );
		if ( bRes == NULL ) 
		{
			Cudd_RecursiveDeref(dd,E);
			Cudd_RecursiveDeref(dd,T);
			return NULL;
		}
		cuddRef( bRes );
		cuddDeref( E );
		cuddDeref( T );
	}

	// do not keep the result if the ref count is only 1, since it will not be visited again
	if ( pUnit->n != 1 )
	{
		 // while we traversed the diagram, the hash entry to which HKey points,
		 // might have been used. Make sure that its signature is different.
		 for ( ; p->HTable[HKey].Sign == p->Signature; HKey = (HKey+1) % p->nTableSize );
		 p->HTable[HKey].Sign = p->Signature;
		 p->HTable[HKey].Arg1 = pUnit;
		 p->HTable[HKey].Arg2 = (reo_unit *)bRes;  

		 // add the DD to the referenced DD list in order to be able to store it in cache
		 p->pRefNodes[p->nRefNodes++] = bRes;  Cudd_Ref( bRes ); 
		 // no need to do this, because the garbage collection will not take bRes away
		 // it is held by the diagram in the making
	}
	// increment the counter of nodes
	p->nNodesCur++;
	cuddDeref( bRes );
	return Cudd_NotCond( bRes, fComp );
}